

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O1

void __thiscall Jinx::Impl::Parser::ParseExpression(Parser *this,SymbolListCItr endSymbol)

{
  pointer pDVar1;
  ulong uVar2;
  byte bVar3;
  uint8_t *puVar4;
  pointer pSVar5;
  int iVar6;
  Opcode val;
  Symbol *pSVar7;
  SymbolListCItr SVar8;
  ulong uVar9;
  element_type *peVar10;
  DebugLineEntry local_30;
  
  if (((this->m_error != false) ||
      (pSVar5 = (this->m_currentSymbol)._M_current,
      pSVar5 == (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish)) || (pSVar5->type != SquareOpen)) {
    pSVar7 = (this->m_currentSymbol)._M_current;
    SVar8._M_current = endSymbol._M_current;
    if (pSVar7 != endSymbol._M_current) {
      do {
        SVar8._M_current = endSymbol._M_current;
        if ((pSVar7 == (this->m_symbolList->
                       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)
                       ._M_impl.super__Vector_impl_data._M_finish) ||
           (SVar8._M_current = pSVar7, pSVar7->type == Comma)) break;
        pSVar7 = pSVar7 + 1;
        SVar8._M_current = endSymbol._M_current;
      } while (pSVar7 != endSymbol._M_current);
    }
    ParseSubexpression(this,SVar8);
    if (this->m_error != false) {
      return;
    }
    pSVar5 = (this->m_currentSymbol)._M_current;
    if (pSVar5 == (this->m_symbolList->
                  super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                  _M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    if (pSVar5->type != Comma) {
      return;
    }
    this->m_lastLine = pSVar5->lineNumber;
    iVar6 = 1;
    do {
      (this->m_currentSymbol)._M_current = pSVar5 + 1;
      if (((this->m_error == false) &&
          (pSVar5 = (this->m_currentSymbol)._M_current,
          pSVar5 != (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish)) && (pSVar5->type == NewLine)) {
        this->m_lastLine = pSVar5->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar5 + 1;
      }
      pSVar7 = (this->m_currentSymbol)._M_current;
      SVar8._M_current = endSymbol._M_current;
      if (pSVar7 != endSymbol._M_current) {
        do {
          SVar8._M_current = endSymbol._M_current;
          if ((pSVar7 == (this->m_symbolList->
                         super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                         )._M_impl.super__Vector_impl_data._M_finish) ||
             (SVar8._M_current = pSVar7, pSVar7->type == Comma)) break;
          pSVar7 = pSVar7 + 1;
          SVar8._M_current = endSymbol._M_current;
        } while (pSVar7 != endSymbol._M_current);
      }
      ParseSubexpression(this,SVar8);
      iVar6 = iVar6 + 1;
      if (((this->m_error != false) ||
          (pSVar5 = (this->m_currentSymbol)._M_current,
          pSVar5 == (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish)) || (pSVar5->type != Comma))
      goto LAB_0020a4c0;
      this->m_lastLine = pSVar5->lineNumber;
    } while( true );
  }
  this->m_lastLine = pSVar5->lineNumber;
  (this->m_currentSymbol)._M_current = pSVar5 + 1;
  pSVar5 = (this->m_currentSymbol)._M_current;
  if ((pSVar5 != (this->m_symbolList->
                 super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                 _M_impl.super__Vector_impl_data._M_finish) && (pSVar5->type == SquareClose)) {
    this->m_lastLine = pSVar5->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar5 + 1;
    if ((CommonData::globalParams.enableDebugInfo == true) &&
       ((pDVar1 = (this->m_debugLines).
                  super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        (this->m_debugLines).
        super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_start == pDVar1 ||
        (pDVar1[-1].lineNumber != this->m_lastLine)))) {
      local_30.lineNumber = this->m_lastLine;
      local_30.opcodePosition = (uint32_t)(this->m_writer).m_pos;
      std::
      vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
      ::emplace_back<Jinx::Impl::DebugLineEntry>(&this->m_debugLines,&local_30);
    }
    BinaryWriter::Write<Jinx::Impl::Opcode,unsigned_char>(&this->m_writer,PushColl);
    peVar10 = (this->m_writer).m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    uVar9 = (this->m_writer).m_pos;
    if (peVar10->m_size < uVar9) goto LAB_0020a7ea;
    uVar2 = peVar10->m_capacity;
    if (uVar2 < uVar9 + 4) {
      uVar9 = uVar2 + (uVar2 >> 1) + 4;
      if (uVar2 <= uVar9 && uVar9 - uVar2 != 0) {
        if (peVar10->m_data != (uint8_t *)0x0) {
          LOCK();
          Mem::freeCount.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)
               ((long)Mem::freeCount.super___atomic_base<unsigned_long>._M_i + 1);
          UNLOCK();
        }
        LOCK();
        Mem::allocationCount.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)
             ((long)Mem::allocationCount.super___atomic_base<unsigned_long>._M_i + 1);
        UNLOCK();
        LOCK();
        Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)
             ((long)Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i + (uVar9 - uVar2));
        UNLOCK();
        puVar4 = (uint8_t *)
                 std::function<void_*(void_*,_unsigned_long,_unsigned_long)>::operator()
                           (&Mem::reallocFn,peVar10->m_data,uVar9,uVar2);
        peVar10->m_data = puVar4;
        peVar10->m_capacity = uVar9;
      }
    }
    puVar4 = peVar10->m_data + (this->m_writer).m_pos;
    puVar4[0] = '\0';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    goto LAB_0020a595;
  }
  ParseSubexpression(this,endSymbol);
  if ((this->m_error != false) ||
     ((pSVar5 = (this->m_currentSymbol)._M_current,
      pSVar5 == (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish || (pSVar5->type != Comma)))) {
    Error<>(this,"Expected comma separating key-value pair");
    return;
  }
  this->m_lastLine = pSVar5->lineNumber;
  (this->m_currentSymbol)._M_current = pSVar5 + 1;
  ParseExpression(this,endSymbol);
  if (((this->m_error == false) &&
      (pSVar5 = (this->m_currentSymbol)._M_current,
      pSVar5 != (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish)) && (pSVar5->type == SquareClose)) {
    this->m_lastLine = pSVar5->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar5 + 1;
  }
  else {
    local_30 = (DebugLineEntry)CommonData::symbolTypeName[0x15];
    Error<char_const*>(this,"Expected symbol %s",(char **)&local_30);
  }
  iVar6 = 1;
  if (this->m_error == false) {
    bVar3 = 0;
    do {
      pSVar5 = (this->m_currentSymbol)._M_current;
      if ((pSVar5 == (this->m_symbolList->
                     super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                     _M_impl.super__Vector_impl_data._M_finish) || (pSVar5->type != Comma)) break;
      this->m_lastLine = pSVar5->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar5 + 1;
      if ((bVar3 & 1) == 0) {
        pSVar5 = (this->m_currentSymbol)._M_current;
        if ((pSVar5 != (this->m_symbolList->
                       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)
                       ._M_impl.super__Vector_impl_data._M_finish) && (pSVar5->type == NewLine)) {
          this->m_lastLine = pSVar5->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar5 + 1;
        }
        if ((((bVar3 & 1) != 0) ||
            (pSVar5 = (this->m_currentSymbol)._M_current,
            pSVar5 == (this->m_symbolList->
                      super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                      _M_impl.super__Vector_impl_data._M_finish)) || (pSVar5->type != SquareOpen))
        goto LAB_0020a6af;
        this->m_lastLine = pSVar5->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar5 + 1;
      }
      else {
LAB_0020a6af:
        local_30 = (DebugLineEntry)CommonData::symbolTypeName[0x14];
        Error<char_const*>(this,"Expected symbol %s",(char **)&local_30);
      }
      ParseSubexpression(this,endSymbol);
      if (((this->m_error == false) &&
          (pSVar5 = (this->m_currentSymbol)._M_current,
          pSVar5 != (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish)) && (pSVar5->type == Comma)) {
        this->m_lastLine = pSVar5->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar5 + 1;
      }
      else {
        local_30 = (DebugLineEntry)CommonData::symbolTypeName[0xf];
        Error<char_const*>(this,"Expected symbol %s",(char **)&local_30);
      }
      ParseSubexpression(this,endSymbol);
      if (((this->m_error == false) &&
          (pSVar5 = (this->m_currentSymbol)._M_current,
          pSVar5 != (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish)) && (pSVar5->type == SquareClose)) {
        this->m_lastLine = pSVar5->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar5 + 1;
      }
      else {
        local_30 = (DebugLineEntry)CommonData::symbolTypeName[0x15];
        Error<char_const*>(this,"Expected symbol %s",(char **)&local_30);
      }
      iVar6 = iVar6 + 1;
      bVar3 = this->m_error;
    } while ((bool)bVar3 != true);
  }
  if ((CommonData::globalParams.enableDebugInfo == true) &&
     ((pDVar1 = (this->m_debugLines).
                super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      (this->m_debugLines).
      super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_start == pDVar1 ||
      (pDVar1[-1].lineNumber != this->m_lastLine)))) {
    local_30.lineNumber = this->m_lastLine;
    local_30.opcodePosition = (uint32_t)(this->m_writer).m_pos;
    std::
    vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
    ::emplace_back<Jinx::Impl::DebugLineEntry>(&this->m_debugLines,&local_30);
  }
  val = PushColl;
LAB_0020a512:
  BinaryWriter::Write<Jinx::Impl::Opcode,unsigned_char>(&this->m_writer,val);
  peVar10 = (this->m_writer).m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  uVar9 = (this->m_writer).m_pos;
  if (peVar10->m_size < uVar9) {
LAB_0020a7ea:
    __assert_fail("*pos <= m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                  ,0xb6f,"void Jinx::Buffer::Write(size_t *, const void *, size_t)");
  }
  uVar2 = peVar10->m_capacity;
  if (uVar2 < uVar9 + 4) {
    uVar9 = uVar2 + (uVar2 >> 1) + 4;
    if (uVar2 <= uVar9 && uVar9 - uVar2 != 0) {
      if (peVar10->m_data != (uint8_t *)0x0) {
        LOCK();
        Mem::freeCount.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)
             ((long)Mem::freeCount.super___atomic_base<unsigned_long>._M_i + 1);
        UNLOCK();
      }
      LOCK();
      Mem::allocationCount.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)
           ((long)Mem::allocationCount.super___atomic_base<unsigned_long>._M_i + 1);
      UNLOCK();
      LOCK();
      Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)
           ((long)Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i + (uVar9 - uVar2));
      UNLOCK();
      puVar4 = (uint8_t *)
               std::function<void_*(void_*,_unsigned_long,_unsigned_long)>::operator()
                         (&Mem::reallocFn,peVar10->m_data,uVar9,uVar2);
      peVar10->m_data = puVar4;
      peVar10->m_capacity = uVar9;
    }
  }
  *(int *)(peVar10->m_data + (this->m_writer).m_pos) = iVar6;
LAB_0020a595:
  uVar9 = (this->m_writer).m_pos + 4;
  (this->m_writer).m_pos = uVar9;
  if (peVar10->m_size < uVar9) {
    peVar10->m_size = uVar9;
  }
  return;
LAB_0020a4c0:
  if ((CommonData::globalParams.enableDebugInfo == true) &&
     ((pDVar1 = (this->m_debugLines).
                super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
                ._M_impl.super__Vector_impl_data._M_finish,
      (this->m_debugLines).
      super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
      ._M_impl.super__Vector_impl_data._M_start == pDVar1 ||
      (pDVar1[-1].lineNumber != this->m_lastLine)))) {
    local_30.lineNumber = this->m_lastLine;
    local_30.opcodePosition = (uint32_t)(this->m_writer).m_pos;
    std::
    vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
    ::emplace_back<Jinx::Impl::DebugLineEntry>(&this->m_debugLines,&local_30);
  }
  val = PushList;
  goto LAB_0020a512;
}

Assistant:

inline void Parser::ParseExpression(SymbolListCItr endSymbol)
	{
		// Check first for an opening bracket, which indicates either an index operator or a key-value pair.
		if (Accept(SymbolType::SquareOpen))
		{
			if (Accept(SymbolType::SquareClose))
			{
				// If we immediately see a close bracket, create an empty collection
				EmitOpcode(Opcode::PushColl);
				EmitCount(0);
			}
			else
			{
				ParseSubexpression(endSymbol);

				// If we see a comma after a square open bracket, we're parsing a key-value pair
				if (Accept(SymbolType::Comma))
				{
					ParseExpression(endSymbol);
					Expect(SymbolType::SquareClose);

					// Parse all subsequent key-value pairs
					uint32_t count = 1;
					while (Accept(SymbolType::Comma))
					{
						Accept(SymbolType::NewLine);
						Expect(SymbolType::SquareOpen);
						ParseSubexpression(endSymbol);
						Expect(SymbolType::Comma);
						ParseSubexpression(endSymbol);
						Expect(SymbolType::SquareClose);
						++count;
					}

					// Pop all key-value pairs and push a new collection onto the stack
					EmitOpcode(Opcode::PushColl);
					EmitCount(count);
				}
				else
				{
					Error("Expected comma separating key-value pair");
				}
			}
		}
		else
		{
			// Advance only to first comma
			auto localEndSymbol = GetNextSymbolOfType(SymbolType::Comma, endSymbol);

			// Parse the first subexpression, defined as any normal expression excluding index operators or lists, 
			// which are handled in this function
			ParseSubexpression(localEndSymbol);

			// If we finish the first subexpression with a common, then we're parsing an indexed list
			if (Accept(SymbolType::Comma))
			{
				// Parse all subexpressions in comma-delimited list
				uint32_t count = 1;
				do
				{
					Accept(SymbolType::NewLine);
					localEndSymbol = GetNextSymbolOfType(SymbolType::Comma, endSymbol);
					ParseSubexpression(localEndSymbol);
					++count;
				} 
				while (Accept(SymbolType::Comma));

				// Pop all key-value pairs and push the results on the stack
				EmitOpcode(Opcode::PushList);
				EmitCount(count);
			}
		}
	}